

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcUnroll.c
# Opt level: O0

void Unr_ManProfileRanks(Vec_Int_t *vRanks)

{
  int iVar1;
  uint uVar2;
  Vec_Int_t *p;
  uint local_30;
  int nExtras;
  int Count;
  int Rank;
  int i;
  Vec_Int_t *vCounts;
  int RankMax;
  Vec_Int_t *vRanks_local;
  
  iVar1 = Vec_IntFindMax(vRanks);
  p = Vec_IntStart(iVar1 + 1);
  local_30 = 0;
  for (Count = 0; iVar1 = Vec_IntSize(vRanks), Count < iVar1; Count = Count + 1) {
    iVar1 = Vec_IntEntry(vRanks,Count);
    Vec_IntAddToEntry(p,iVar1,1);
  }
  for (Count = 0; iVar1 = Vec_IntSize(p), Count < iVar1; Count = Count + 1) {
    uVar2 = Vec_IntEntry(p,Count);
    if (uVar2 != 0) {
      iVar1 = Vec_IntSize(vRanks);
      printf("%2d : %8d  (%6.2f %%)\n",((double)(int)uVar2 * 100.0) / (double)iVar1,
             (ulong)(uint)Count,(ulong)uVar2);
      local_30 = uVar2 * Count + local_30;
    }
  }
  iVar1 = Vec_IntSize(vRanks);
  printf("Extra space = %d (%6.2f %%)  ",((double)(int)local_30 * 100.0) / (double)iVar1,
         (ulong)local_30);
  Vec_IntFree(p);
  return;
}

Assistant:

void Unr_ManProfileRanks( Vec_Int_t * vRanks )
{
    int RankMax = Vec_IntFindMax( vRanks );
    Vec_Int_t * vCounts = Vec_IntStart( RankMax+1 );
    int i, Rank, Count, nExtras = 0;
    Vec_IntForEachEntry( vRanks, Rank, i )
        Vec_IntAddToEntry( vCounts, Rank, 1 );
    Vec_IntForEachEntry( vCounts, Count, i )
    {
        if ( Count == 0 )
            continue;
        printf( "%2d : %8d  (%6.2f %%)\n", i, Count, 100.0 * Count / Vec_IntSize(vRanks) );
        nExtras += Count * i;
    }
    printf( "Extra space = %d (%6.2f %%)  ", nExtras, 100.0 * nExtras / Vec_IntSize(vRanks) );
    Vec_IntFree( vCounts );
}